

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<46UL> *
mserialize::cx_strcat<37ul,7ul,1ul,1ul>
          (cx_string<37UL> *strings,cx_string<7UL> *strings_1,cx_string<1UL> *strings_2,
          cx_string<1UL> *strings_3)

{
  cx_string<1UL> *in_RCX;
  cx_string<7UL> *in_RDX;
  cx_string<37UL> *in_RSI;
  cx_string<46UL> *in_RDI;
  cx_string<1UL> *in_R8;
  size_t s;
  size_t i;
  char *out;
  size_t size [5];
  char *data [5];
  char buffer [47];
  char *in_stack_ffffffffffffff30;
  ulong local_c8;
  char *local_c0;
  size_t local_b0 [5];
  char *local_88;
  data_ref local_80;
  data_ref local_78;
  data_ref local_70;
  data_ref local_68;
  char local_58 [56];
  cx_string<1UL> *local_20;
  cx_string<1UL> *local_18;
  cx_string<7UL> *local_10;
  cx_string<37UL> *local_8;
  
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(local_58,0,0x2f);
  local_88 = "";
  local_80 = cx_string<37UL>::data(local_8);
  local_78 = cx_string<7UL>::data(local_10);
  local_70 = cx_string<1UL>::data(local_18);
  local_68 = cx_string<1UL>::data(local_20);
  local_b0[0] = cx_string<37UL>::size(local_8);
  local_b0[1] = cx_string<7UL>::size(local_10);
  local_b0[2] = cx_string<1UL>::size(local_18);
  local_b0[3] = cx_string<1UL>::size(local_20);
  local_c0 = local_58;
  for (local_c8 = 1; local_c8 < 5; local_c8 = local_c8 + 1) {
    for (in_stack_ffffffffffffff30 = (char *)0x0;
        in_stack_ffffffffffffff30 < (cx_string<46UL> *)local_b0[local_c8 - 1];
        in_stack_ffffffffffffff30 = in_stack_ffffffffffffff30 + 1) {
      *local_c0 = in_stack_ffffffffffffff30[(long)(&local_88)[local_c8]];
      local_c0 = local_c0 + 1;
    }
  }
  cx_string<46UL>::cx_string((cx_string<46UL> *)in_stack_ffffffffffffff30,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}